

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O0

int ncnn::from_gray2rgba(uchar *gray,int w,int h,int stride,Mat *m,Allocator *allocator)

{
  bool bVar1;
  Mat alpha_channel;
  int in_stack_0000004c;
  int in_stack_00000050;
  int in_stack_00000054;
  Mat rgb_channels;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff48;
  float in_stack_ffffffffffffff4c;
  int in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  Mat *in_stack_ffffffffffffff60;
  undefined4 local_4;
  
  Mat::create(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,
              in_stack_ffffffffffffff54,
              CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
              (Allocator *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  if (bVar1) {
    local_4 = -100;
  }
  else {
    Mat::channel_range((Mat *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                       in_stack_ffffffffffffff54,in_stack_ffffffffffffff50);
    from_gray2rgb((uchar *)rgb_channels.data,in_stack_00000054,in_stack_00000050,in_stack_0000004c,
                  (Mat *)alpha_channel.cstep,(Allocator *)alpha_channel._48_8_);
    Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                 in_stack_ffffffffffffff44);
    Mat::fill((Mat *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
              in_stack_ffffffffffffff4c);
    local_4 = 0;
    Mat::~Mat((Mat *)0x11ea92);
    Mat::~Mat((Mat *)0x11ea9c);
  }
  return local_4;
}

Assistant:

static int from_gray2rgba(const unsigned char* gray, int w, int h, int stride, Mat& m, Allocator* allocator)
{
    m.create(w, h, 4, 4u, allocator);
    if (m.empty())
        return -100;

    Mat rgb_channels = m.channel_range(0, 3);
    from_gray2rgb(gray, w, h, stride, rgb_channels, allocator);

    Mat alpha_channel = m.channel(3);
    alpha_channel.fill(255.f);

    return 0;
}